

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcLightSource::~IfcLightSource(IfcLightSource *this)

{
  undefined1 *puVar1;
  
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x849608;
  *(undefined8 *)&this->field_0x80 = 0x849680;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x849630;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x849658;
  puVar1 = *(undefined1 **)&(this->super_IfcGeometricRepresentationItem).field_0x30;
  if (puVar1 != &this->field_0x40) {
    operator_delete(puVar1,*(long *)&this->field_0x40 + 1);
  }
  operator_delete(this,0x98);
  return;
}

Assistant:

IfcLightSource() : Object("IfcLightSource") {}